

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

ErrCode __thiscall Regex::prepare(Regex *this,string *regex)

{
  char cVar1;
  ElmentType EVar2;
  pointer pcVar3;
  bool bVar4;
  size_type sVar5;
  Element *pEVar6;
  Element *pEVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  bool bVar12;
  Element *local_58;
  int local_48;
  ElmentType local_34;
  
  sVar5 = regex->_M_string_length;
  local_58 = &this->mRoot;
  (this->mRoot).mType = TYPE_SEQUENCE;
  local_48 = 0;
  iVar9 = 0;
  iVar11 = 0;
  do {
    if ((int)sVar5 <= iVar11) {
      this->mState = STATE_PREPARED;
      return kNoError;
    }
    lVar10 = (long)iVar11;
    pcVar3 = (regex->_M_dataplus)._M_p;
    cVar1 = pcVar3[lVar10];
    switch(cVar1) {
    case '(':
      if (local_48 == 1) {
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x149);
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        cVar1 = (regex->_M_dataplus)._M_p[lVar10];
        pEVar6->mTermStartChar = cVar1;
        pEVar6->mTermEndChar = cVar1;
        Element::insertChild(local_58,pEVar6);
LAB_0011c3c4:
        local_48 = 1;
      }
      else {
        iVar9 = iVar9 + 1;
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x14e);
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_OR;
        Element::insertChild(local_58,pEVar6);
        local_58 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x153);
        local_58->mChild = (Element *)0x0;
        local_58->mParent = (Element *)0x0;
        local_58->mNext = (Element *)0x0;
        local_58->mRepeatMin = 1;
        local_58->mRepeatMax = 1;
        local_58->mClassInvert = false;
        local_58->mGroupNum = -1;
        local_58->mType = TYPE_SEQUENCE;
        Element::insertChild(pEVar6,local_58);
      }
      break;
    case ')':
      if (iVar9 < 1) {
        if (local_48 == 2) goto LAB_0011c393;
        iVar8 = 0x16d;
LAB_0011c3da:
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,iVar8);
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        cVar1 = (regex->_M_dataplus)._M_p[lVar10];
        pEVar6->mTermStartChar = cVar1;
        pEVar6->mTermEndChar = cVar1;
        goto LAB_0011c414;
      }
      iVar9 = iVar9 + -1;
      local_58 = local_58->mParent->mParent;
      break;
    case '*':
      if (local_48 == 1) {
LAB_0011ce6d:
        std::__cxx11::string::assign((char *)&this->mErrorData);
        return kInvalidRequest;
      }
      pEVar6 = Element::getLastChild(local_58);
      pEVar6->mRepeatMin = 0;
      pEVar6->mRepeatMax = -1;
      if (2 < pEVar6->mType - TYPE_OR) {
        __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0xd6,"JetHead::ErrCode Regex::prepare(const std::string &)");
      }
      break;
    case '+':
      if (local_48 == 1) goto LAB_0011ce6d;
      pEVar6 = Element::getLastChild(local_58);
      pEVar6->mRepeatMin = 1;
      pEVar6->mRepeatMax = -1;
      if (2 < pEVar6->mType - TYPE_OR) {
        __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0xdf,"JetHead::ErrCode Regex::prepare(const std::string &)");
      }
      break;
    case ',':
switchD_0011bd9e_caseD_2c:
      if (local_48 != 2) {
        iVar8 = 0x171;
        goto LAB_0011c3da;
      }
LAB_0011c393:
      pEVar6 = Element::getLastChild(local_58);
      pEVar6->mTermEndChar = (regex->_M_dataplus)._M_p[lVar10];
      local_48 = 1;
      break;
    case '-':
      if (local_48 == 2) {
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mTermEndChar = (regex->_M_dataplus)._M_p[lVar10];
        goto LAB_0011c3c4;
      }
      if (local_48 != 1) {
        iVar8 = 0x143;
        goto LAB_0011c3da;
      }
      pEVar6 = Element::getLastChild(local_58);
      local_48 = 2;
      if (pEVar6->mTermStartChar != pEVar6->mTermEndChar) goto LAB_0011ce6d;
      break;
    case '.':
      if (local_48 == 2) goto LAB_0011ce6d;
      pEVar6 = (Element *)
               operator_new(0x30,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                            ,0xcd);
      pEVar6->mParent = (Element *)0x0;
      pEVar6->mNext = (Element *)0x0;
      pEVar6->mChild = (Element *)0x0;
      pEVar6->mRepeatMin = 1;
      pEVar6->mRepeatMax = 1;
      pEVar6->mClassInvert = false;
      pEVar6->mGroupNum = -1;
      pEVar6->mType = TYPE_TERMINAL;
      pEVar6->mTermStartChar = '\0';
      pEVar6->mTermEndChar = '\x7f';
LAB_0011c414:
      Element::insertChild(local_58,pEVar6);
      break;
    default:
      if (cVar1 == '?') {
        if (local_48 == 1) goto LAB_0011ce6d;
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mRepeatMin = 0;
        pEVar6->mRepeatMax = 1;
        if (2 < pEVar6->mType - TYPE_OR) {
          __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                        ,0xe8,"JetHead::ErrCode Regex::prepare(const std::string &)");
        }
        break;
      }
      if (cVar1 == '[') {
        if (local_48 == 1) goto LAB_0011ce6d;
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x121);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_CLASS;
        bVar12 = (regex->_M_dataplus)._M_p[lVar10 + 1] == '^';
        if (bVar12) {
          iVar11 = iVar11 + 1;
        }
        pEVar6->mClassInvert = bVar12;
        Element::insertChild(local_58,pEVar6);
        local_58 = pEVar6;
        goto LAB_0011c3c4;
      }
      if (cVar1 == '|') {
        if (iVar9 < 1) {
          if (local_48 == 2) goto LAB_0011c393;
          iVar8 = 0x163;
          goto LAB_0011c3da;
        }
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x15d);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_SEQUENCE;
        Element::insertChild(local_58->mParent,pEVar6);
        local_58 = pEVar6;
        break;
      }
      if (cVar1 == ']') {
        if (local_48 != 1) {
          if (local_48 == 2) goto LAB_0011ce6d;
          iVar8 = 0x137;
          goto LAB_0011c3da;
        }
        local_48 = 0;
        local_58 = local_58->mParent;
        break;
      }
      if (cVar1 == '{') {
        if (local_48 == 1) goto LAB_0011ce6d;
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mRepeatMin = 0;
        pEVar6->mRepeatMax = 0;
        if (2 < pEVar6->mType - TYPE_OR) {
          __assert_fail("new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                        ,0xf2,"JetHead::ErrCode Regex::prepare(const std::string &)");
        }
        pcVar3 = (regex->_M_dataplus)._M_p;
        bVar12 = true;
        iVar8 = 0;
        iVar11 = 0;
        while( true ) {
          while( true ) {
            lVar10 = lVar10 + 1;
            cVar1 = pcVar3[lVar10];
            if (cVar1 != ',') break;
            bVar4 = !bVar12;
            bVar12 = false;
            if (bVar4) goto LAB_0011ce6d;
          }
          if (cVar1 == '}') break;
          if (9 < (byte)(cVar1 - 0x30U)) goto LAB_0011ce6d;
          if (bVar12) {
            pEVar6->mRepeatMin = iVar11 * 10;
            iVar11 = iVar11 * 10 + (int)pcVar3[lVar10] + -0x30;
            pEVar6->mRepeatMin = iVar11;
            bVar12 = true;
          }
          else {
            pEVar6->mRepeatMax = iVar8 * 10;
            iVar8 = iVar8 * 10 + (int)pcVar3[lVar10] + -0x30;
            pEVar6->mRepeatMax = iVar8;
            bVar12 = false;
          }
        }
        if (bVar12) {
          pEVar6->mRepeatMax = iVar11;
        }
        iVar11 = (int)lVar10;
        break;
      }
      if (cVar1 != '\\') goto switchD_0011bd9e_caseD_2c;
      cVar1 = pcVar3[lVar10 + 1];
      lVar10 = lVar10 + 1;
      iVar11 = (int)lVar10;
      switch(cVar1) {
      case 'n':
        if (local_48 != 2) {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xb7);
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mClassInvert = false;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_TERMINAL;
          pEVar6->mTermStartChar = '\n';
          pEVar6->mTermEndChar = '\n';
LAB_0011c774:
          Element::insertChild(local_58,pEVar6);
          goto LAB_0011c425;
        }
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mTermEndChar = '\n';
        break;
      case 'o':
      case 'p':
      case 'q':
      case 'u':
      case 'v':
switchD_0011be65_caseD_6f:
        if (local_48 != 2) {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,199);
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mClassInvert = false;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_TERMINAL;
          cVar1 = (regex->_M_dataplus)._M_p[lVar10];
          pEVar6->mTermStartChar = cVar1;
          pEVar6->mTermEndChar = cVar1;
          goto LAB_0011c774;
        }
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mTermEndChar = (regex->_M_dataplus)._M_p[lVar10];
        break;
      case 'r':
        if (local_48 != 2) {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xbb);
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mClassInvert = false;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_TERMINAL;
          pEVar6->mTermStartChar = '\r';
          pEVar6->mTermEndChar = '\r';
          goto LAB_0011c774;
        }
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mTermEndChar = '\r';
        break;
      case 's':
        local_34 = local_58->mType;
        if (local_34 != TYPE_CLASS) {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x91);
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_CLASS;
          pEVar6->mClassInvert = false;
          Element::insertChild(local_58,pEVar6);
          local_58 = pEVar6;
        }
        if (local_48 == 2) {
          pEVar6 = Element::getLastChild(local_58);
          pEVar6->mTermEndChar = ' ';
          local_48 = 1;
        }
        else {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x92);
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mClassInvert = false;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_TERMINAL;
          pEVar6->mTermStartChar = ' ';
          pEVar6->mTermEndChar = ' ';
          Element::insertChild(local_58,pEVar6);
        }
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x93);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = '\t';
        pEVar6->mTermEndChar = '\t';
        Element::insertChild(local_58,pEVar6);
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x94);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = '\n';
        pEVar6->mTermEndChar = '\n';
        Element::insertChild(local_58,pEVar6);
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x95);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = '\r';
        pEVar6->mTermEndChar = '\r';
        Element::insertChild(local_58,pEVar6);
        iVar8 = 0x96;
LAB_0011cdf2:
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,iVar8);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = '\f';
        pEVar6->mTermEndChar = '\f';
        goto LAB_0011ce1b;
      case 't':
        if (local_48 != 2) {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0xb3);
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mClassInvert = false;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_TERMINAL;
          pEVar6->mTermStartChar = '\t';
          pEVar6->mTermEndChar = '\t';
          goto LAB_0011c774;
        }
        pEVar6 = Element::getLastChild(local_58);
        pEVar6->mTermEndChar = '\t';
        break;
      case 'w':
        local_34 = local_58->mType;
        if (local_34 != TYPE_CLASS) {
          pEVar6 = (Element *)
                   operator_new(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                ,0x7e);
          pEVar6->mParent = (Element *)0x0;
          pEVar6->mNext = (Element *)0x0;
          pEVar6->mChild = (Element *)0x0;
          pEVar6->mRepeatMin = 1;
          pEVar6->mRepeatMax = 1;
          pEVar6->mGroupNum = -1;
          pEVar6->mType = TYPE_CLASS;
          pEVar6->mClassInvert = false;
          Element::insertChild(local_58,pEVar6);
          local_58 = pEVar6;
        }
        if (local_48 == 2) goto LAB_0011ce6d;
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x7f);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = 'a';
        pEVar6->mTermEndChar = 'z';
        Element::insertChild(local_58,pEVar6);
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x80);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = 'A';
        pEVar6->mTermEndChar = 'Z';
        Element::insertChild(local_58,pEVar6);
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x81);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = '0';
        pEVar6->mTermEndChar = '9';
        Element::insertChild(local_58,pEVar6);
        pEVar6 = (Element *)
                 operator_new(0x30,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                              ,0x82);
        pEVar6->mParent = (Element *)0x0;
        pEVar6->mNext = (Element *)0x0;
        pEVar6->mChild = (Element *)0x0;
        pEVar6->mRepeatMin = 1;
        pEVar6->mRepeatMax = 1;
        pEVar6->mClassInvert = false;
        pEVar6->mGroupNum = -1;
        pEVar6->mType = TYPE_TERMINAL;
        pEVar6->mTermStartChar = '_';
        pEVar6->mTermEndChar = '_';
LAB_0011ce1b:
        Element::insertChild(local_58,pEVar6);
        if (local_34 != TYPE_CLASS) {
          local_58 = local_58->mParent;
        }
        goto LAB_0011c425;
      case 'x':
        goto switchD_0011be65_caseD_78;
      default:
        if (cVar1 != '0') {
          if (cVar1 == 'D') {
            EVar2 = local_58->mType;
            pEVar6 = local_58;
            if (EVar2 != TYPE_CLASS) {
              pEVar6 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0xac);
              pEVar6->mParent = (Element *)0x0;
              pEVar6->mNext = (Element *)0x0;
              pEVar6->mChild = (Element *)0x0;
              pEVar6->mRepeatMin = 1;
              pEVar6->mRepeatMax = 1;
              pEVar6->mGroupNum = -1;
              pEVar6->mType = TYPE_CLASS;
              pEVar6->mClassInvert = false;
              Element::insertChild(local_58,pEVar6);
            }
            pEVar6->mClassInvert = true;
            if (local_48 == 2) goto LAB_0011ce6d;
            pEVar7 = (Element *)
                     operator_new(0x30,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                  ,0xae);
            pEVar7->mParent = (Element *)0x0;
            pEVar7->mNext = (Element *)0x0;
            pEVar7->mChild = (Element *)0x0;
            pEVar7->mRepeatMin = 1;
            pEVar7->mRepeatMax = 1;
            pEVar7->mClassInvert = false;
            pEVar7->mGroupNum = -1;
            pEVar7->mType = TYPE_TERMINAL;
            pEVar7->mTermStartChar = '0';
            pEVar7->mTermEndChar = '9';
            Element::insertChild(pEVar6,pEVar7);
            local_58 = pEVar6;
          }
          else {
            if (cVar1 == 'S') {
              local_34 = local_58->mType;
              pEVar6 = local_58;
              if (local_34 != TYPE_CLASS) {
                pEVar6 = (Element *)
                         operator_new(0x30,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                      ,0x9b);
                pEVar6->mParent = (Element *)0x0;
                pEVar6->mNext = (Element *)0x0;
                pEVar6->mChild = (Element *)0x0;
                pEVar6->mRepeatMin = 1;
                pEVar6->mRepeatMax = 1;
                pEVar6->mGroupNum = -1;
                pEVar6->mType = TYPE_CLASS;
                pEVar6->mClassInvert = false;
                Element::insertChild(local_58,pEVar6);
              }
              pEVar6->mClassInvert = true;
              if (local_48 == 2) {
                pEVar7 = Element::getLastChild(pEVar6);
                pEVar7->mTermEndChar = ' ';
                local_48 = 1;
              }
              else {
                pEVar7 = (Element *)
                         operator_new(0x30,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                      ,0x9d);
                pEVar7->mParent = (Element *)0x0;
                pEVar7->mNext = (Element *)0x0;
                pEVar7->mChild = (Element *)0x0;
                pEVar7->mRepeatMin = 1;
                pEVar7->mRepeatMax = 1;
                pEVar7->mClassInvert = false;
                pEVar7->mGroupNum = -1;
                pEVar7->mType = TYPE_TERMINAL;
                pEVar7->mTermStartChar = ' ';
                pEVar7->mTermEndChar = ' ';
                Element::insertChild(pEVar6,pEVar7);
              }
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x9e);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = '\t';
              pEVar7->mTermEndChar = '\t';
              Element::insertChild(pEVar6,pEVar7);
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x9f);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = '\n';
              pEVar7->mTermEndChar = '\n';
              Element::insertChild(pEVar6,pEVar7);
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0xa0);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = '\r';
              pEVar7->mTermEndChar = '\r';
              Element::insertChild(pEVar6,pEVar7);
              iVar8 = 0xa1;
              local_58 = pEVar6;
              goto LAB_0011cdf2;
            }
            if (cVar1 == 'W') {
              EVar2 = local_58->mType;
              pEVar6 = local_58;
              if (EVar2 != TYPE_CLASS) {
                pEVar6 = (Element *)
                         operator_new(0x30,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                      ,0x87);
                pEVar6->mParent = (Element *)0x0;
                pEVar6->mNext = (Element *)0x0;
                pEVar6->mChild = (Element *)0x0;
                pEVar6->mRepeatMin = 1;
                pEVar6->mRepeatMax = 1;
                pEVar6->mGroupNum = -1;
                pEVar6->mType = TYPE_CLASS;
                pEVar6->mClassInvert = false;
                Element::insertChild(local_58,pEVar6);
              }
              pEVar6->mClassInvert = true;
              if (local_48 == 2) goto LAB_0011ce6d;
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x89);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = 'a';
              pEVar7->mTermEndChar = 'z';
              Element::insertChild(pEVar6,pEVar7);
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x8a);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = 'A';
              pEVar7->mTermEndChar = 'Z';
              Element::insertChild(pEVar6,pEVar7);
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x8b);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = '0';
              pEVar7->mTermEndChar = '9';
              Element::insertChild(pEVar6,pEVar7);
              pEVar7 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0x8c);
              pEVar7->mParent = (Element *)0x0;
              pEVar7->mNext = (Element *)0x0;
              pEVar7->mChild = (Element *)0x0;
              pEVar7->mRepeatMin = 1;
              pEVar7->mRepeatMax = 1;
              pEVar7->mClassInvert = false;
              pEVar7->mGroupNum = -1;
              pEVar7->mType = TYPE_TERMINAL;
              pEVar7->mTermStartChar = '_';
              pEVar7->mTermEndChar = '_';
              Element::insertChild(pEVar6,pEVar7);
              local_58 = pEVar6;
              if (EVar2 != TYPE_CLASS) {
                local_58 = pEVar6->mParent;
              }
              goto LAB_0011c425;
            }
            if (cVar1 != 'd') {
              if (cVar1 == 'f') {
                if (local_48 != 2) {
                  pEVar6 = (Element *)
                           operator_new(0x30,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                        ,0xbf);
                  pEVar6->mParent = (Element *)0x0;
                  pEVar6->mNext = (Element *)0x0;
                  pEVar6->mChild = (Element *)0x0;
                  pEVar6->mRepeatMin = 1;
                  pEVar6->mRepeatMax = 1;
                  pEVar6->mClassInvert = false;
                  pEVar6->mGroupNum = -1;
                  pEVar6->mType = TYPE_TERMINAL;
                  pEVar6->mTermStartChar = '\f';
                  pEVar6->mTermEndChar = '\f';
                  goto LAB_0011c774;
                }
                pEVar6 = Element::getLastChild(local_58);
                pEVar6->mTermEndChar = '\f';
                break;
              }
              goto switchD_0011be65_caseD_6f;
            }
            EVar2 = local_58->mType;
            if (EVar2 != TYPE_CLASS) {
              pEVar6 = (Element *)
                       operator_new(0x30,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                    ,0xa6);
              pEVar6->mParent = (Element *)0x0;
              pEVar6->mNext = (Element *)0x0;
              pEVar6->mChild = (Element *)0x0;
              pEVar6->mRepeatMin = 1;
              pEVar6->mRepeatMax = 1;
              pEVar6->mGroupNum = -1;
              pEVar6->mType = TYPE_CLASS;
              pEVar6->mClassInvert = false;
              Element::insertChild(local_58,pEVar6);
              local_58 = pEVar6;
            }
            if (local_48 == 2) goto LAB_0011ce6d;
            pEVar6 = (Element *)
                     operator_new(0x30,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                                  ,0xa7);
            pEVar6->mParent = (Element *)0x0;
            pEVar6->mNext = (Element *)0x0;
            pEVar6->mChild = (Element *)0x0;
            pEVar6->mRepeatMin = 1;
            pEVar6->mRepeatMax = 1;
            pEVar6->mClassInvert = false;
            pEVar6->mGroupNum = -1;
            pEVar6->mType = TYPE_TERMINAL;
            pEVar6->mTermStartChar = '0';
            pEVar6->mTermEndChar = '9';
            Element::insertChild(local_58,pEVar6);
          }
          if (EVar2 != TYPE_CLASS) {
            local_58 = local_58->mParent;
          }
          goto LAB_0011c425;
        }
        goto switchD_0011be65_caseD_78;
      }
      local_48 = 1;
    }
LAB_0011c425:
    iVar11 = iVar11 + 1;
  } while( true );
switchD_0011be65_caseD_78:
  goto LAB_0011c425;
}

Assistant:

JetHead::ErrCode	Regex::prepare( const JHSTD::string &regex )
{
	int rlen = regex.length();
	Element *new_element = NULL;
	Element *cur_node = &mRoot;
	
	cur_node->mType = TYPE_SEQUENCE;
	int state = IN_UNKNOWN;
	int range_state;
	int in_group = 0;
	
	for ( int i = 0; i < rlen; i++ )
	{
		switch ( regex[ i ] ) 
		{
			case '\\':
				i += 1;
		
				switch( regex[ i ] )
				{
					case 'w':
						CHECK_CLASS
						ADD_TERMINAL( 'a', 'z' );
						ADD_TERMINAL( 'A', 'Z' );
						ADD_TERMINAL( '0', '9' );
						ADD_TERMINAL( '_', '_' );
						END_CLASS
						break;

					case 'W':
						CHECK_CLASS
						cur_node->mClassInvert = true;
						ADD_TERMINAL( 'a', 'z' );
						ADD_TERMINAL( 'A', 'Z' );
						ADD_TERMINAL( '0', '9' );
						ADD_TERMINAL( '_', '_' );
						END_CLASS
						break;
						
					case 's':
						CHECK_CLASS
						ADD_TERMINAL( ' ', ' ' );
						ADD_TERMINAL( '\t', '\t' );
						ADD_TERMINAL( '\n', '\n' );
						ADD_TERMINAL( '\r', '\r' );
						ADD_TERMINAL( '\f', '\f' );
						END_CLASS
						break;

					case 'S':
						CHECK_CLASS
						cur_node->mClassInvert = true;
						ADD_TERMINAL( ' ', ' ' );
						ADD_TERMINAL( '\t', '\t' );
						ADD_TERMINAL( '\n', '\n' );
						ADD_TERMINAL( '\r', '\r' );
						ADD_TERMINAL( '\f', '\f' );
						END_CLASS
						break;

					case 'd':
						CHECK_CLASS
						ADD_TERMINAL( '0', '9' );
						END_CLASS
						break;

					case 'D':
						CHECK_CLASS
						cur_node->mClassInvert = true;
						ADD_TERMINAL( '0', '9' );
						END_CLASS
						break;

					case 't':
						ADD_TERMINAL( '\t', '\t' );
						break;

					case 'n':
						ADD_TERMINAL( '\n', '\n' );
						break;
					
					case 'r':
						ADD_TERMINAL( '\r', '\r' );
						break;
				
					case 'f':
						ADD_TERMINAL( '\f', '\f' );
						break;
						
					case '0':
					case 'x':
						break;
						
					default:
						ADD_TERMINAL( regex[ i ], regex[ i ] );
						break;
				}
				break;
				
			case '.':
				ADD_TERMINAL( 0, 127 );
				break;
				
			case '*':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped * in charater class" )
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 0;
				new_element->mRepeatMax = -1;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				break;
				
			case '+':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped + in charater class" )
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 1;
				new_element->mRepeatMax = -1;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				break;

			case '?':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped ? in charater class" )
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 0;
				new_element->mRepeatMax = 1;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				break;
				
			case '{':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped { in charater class" )
				i += 1;
				new_element = cur_node->getLastChild();
				new_element->mRepeatMin = 0;
				new_element->mRepeatMax = 0;
				assert( new_element->mType == TYPE_CLASS ||new_element->mType == TYPE_OR || new_element->mType == TYPE_TERMINAL );
				range_state = IN_RANGE_MIN;
				while( regex[ i ] != '}' )
				{
					switch( regex[ i ] )
					{
						case ',':
							if ( range_state == IN_RANGE_MIN )
								range_state = IN_RANGE_MAX;
							else
								PARSE_ERROR( "Too many commons in repetition range" )
							break;
							
						default:
							if ( regex[ i ] >= '0' && regex[ i ] <= '9' )
							{
								if ( range_state == IN_RANGE_MIN )
								{
									new_element->mRepeatMin *= 10;
									new_element->mRepeatMin += regex[ i ] - '0';
								}
								else if ( range_state == IN_RANGE_MAX )
								{
									new_element->mRepeatMax *= 10;
									new_element->mRepeatMax += regex[ i ] - '0';
								}
								else
									PARSE_ERROR( "Internal Error" )
							}
							else
								PARSE_ERROR( "Non-numeric value in repetition range" )
					}
					
					i += 1;
				}

				if ( range_state == IN_RANGE_MIN )
					new_element->mRepeatMax = new_element->mRepeatMin;				
				
				LOG_NOTICE( "Range set to %d -> %d", new_element->mRepeatMin, new_element->mRepeatMax );
				break;

			case '[':
				if ( state == IN_CLASS )
					PARSE_ERROR( "Non-excaped [ in charater class" )

				state = IN_CLASS;
				new_element = jh_new Element;
				new_element->mType = TYPE_CLASS;
				if ( regex[ i + 1 ] == '^' )
				{
					new_element->mClassInvert = true;
					i += 1;
				}
				else
					new_element->mClassInvert = false;
				cur_node->insertChild( new_element );
				cur_node = new_element;
				break;
								
			case ']':
				if ( state == IN_CLASS )
				{
					cur_node = cur_node->mParent;
					state = IN_UNKNOWN;
				}
				else if ( state == IN_CLASS_THRU )
					PARSE_ERROR( "Non-escaped square bracket at end of charater range" )
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;

			case '-':
				if ( state == IN_CLASS )
				{
					new_element = cur_node->getLastChild();
					if ( new_element->mTermStartChar != new_element->mTermEndChar )
						PARSE_ERROR( "Invalid terminal for start of charater range" )
					state = IN_CLASS_THRU;
				}
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;
			
			case '(':
				if ( state == IN_CLASS )
				{
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				}
				else
				{
					in_group += 1;
					new_element = jh_new Element;
					new_element->mType = TYPE_OR;
					cur_node->insertChild( new_element );
					cur_node = new_element;
	
					new_element = jh_new Element;
					new_element->mType = TYPE_SEQUENCE;
					cur_node->insertChild( new_element );
					cur_node = new_element;
				}
				break;

			case '|':
				if ( in_group > 0 )
				{
					new_element = jh_new Element;
					new_element->mType = TYPE_SEQUENCE;
					cur_node->mParent->insertChild( new_element );
					cur_node = new_element;
				}
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;

			case ')':
				if ( in_group > 0 )
				{
					in_group -= 1;
					cur_node = cur_node->mParent->mParent;
				}
				else
					ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;
					
			default:
				ADD_TERMINAL( regex[ i ], regex[ i ] );
				break;
		}
	}
			
	mState = Regex::STATE_PREPARED;
	return JetHead::kNoError;
}